

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall Catch::RunContext::handleUnfinishedSections(RunContext *this)

{
  bool bVar1;
  reference pSVar2;
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
  *in_RDI;
  reverse_iterator itEnd;
  reverse_iterator it;
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
  *in_stack_ffffffffffffffd8;
  vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *in_stack_ffffffffffffffe8;
  
  clara::std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::rbegin
            (in_stack_ffffffffffffffe8);
  clara::std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::rend
            (in_stack_ffffffffffffffe8);
  while( true ) {
    bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    pSVar2 = clara::std::
             reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
             ::operator*(in_RDI);
    (**(code **)((long)&(((in_RDI->current)._M_current)->sectionInfo).name.field_2 + 8))
              (in_RDI,pSVar2);
    clara::std::
    reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
    ::operator++(in_RDI);
  }
  clara::std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::clear
            ((vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *)0x134414);
  return;
}

Assistant:

void RunContext::handleUnfinishedSections() {
        // If sections ended prematurely due to an exception we stored their
        // infos here so we can tear them down outside the unwind process.
        for (auto it = m_unfinishedSections.rbegin(),
             itEnd = m_unfinishedSections.rend();
             it != itEnd;
             ++it)
            sectionEnded(*it);
        m_unfinishedSections.clear();
    }